

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O2

void __thiscall prometheus::anon_unknown_0::IntegrationTest::IntegrationTest(IntegrationTest *this)

{
  allocator local_29;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__IntegrationTest_00184da0;
  *(undefined8 *)&(this->fetchPrePerform_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->fetchPrePerform_).super__Function_base._M_functor + 8) = 0;
  (this->fetchPrePerform_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->fetchPrePerform_)._M_invoker = (_Invoker_type)0x0;
  (this->exposer_)._M_t.
  super___uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>._M_t.
  super__Tuple_impl<0UL,_prometheus::Exposer_*,_std::default_delete<prometheus::Exposer>_>.
  super__Head_base<0UL,_prometheus::Exposer_*,_false>._M_head_impl = (Exposer *)0x0;
  (this->base_url_)._M_dataplus._M_p = (pointer)&(this->base_url_).field_2;
  (this->base_url_)._M_string_length = 0;
  (this->base_url_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->default_metrics_path_,"/metrics",&local_29);
  return;
}

Assistant:

void SetUp() override {
    exposer_ = detail::make_unique<Exposer>("127.0.0.1:0");
    auto ports = exposer_->GetListeningPorts();
    base_url_ = std::string("http://127.0.0.1:") + std::to_string(ports.at(0));
  }